

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O1

int LiteScript::Syntax::ReadScript
              (char *text,
              vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *instrl,
              ErrorType *errorType)

{
  uint uVar1;
  ulong uVar2;
  uint i;
  uint uVar3;
  char *text_00;
  
  if (*text == '\0') {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    text_00 = text;
    do {
      uVar3 = 0;
      while( true ) {
        while( true ) {
          if ((0x20 < (ulong)(byte)text_00[uVar3]) ||
             ((0x100000600U >> ((ulong)(byte)text_00[uVar3] & 0x3f) & 1) == 0)) break;
          uVar3 = uVar3 + 1;
        }
        uVar1 = ReadComment(text_00 + uVar3);
        if (uVar1 == 0) break;
        uVar3 = uVar3 + uVar1;
      }
      if ((int)uVar3 < 1) {
        uVar3 = ReadInstruction(text_00,instrl,errorType);
        if ((int)uVar3 < 1) {
          if (uVar3 == 0) {
            *errorType = SCRPT_ERROR_UNKNOW;
            uVar2 = (ulong)(uint)-(int)uVar2;
          }
          else {
            uVar2 = (ulong)(uVar3 - (int)uVar2);
          }
          break;
        }
      }
      uVar2 = (uVar2 & 0xffffffff) + (ulong)uVar3;
      text_00 = text + uVar2;
    } while (text[uVar2] != '\0');
  }
  return (int)uVar2;
}

Assistant:

int LiteScript::Syntax::ReadScript(const char *text, std::vector<Instruction> &instrl, Script::ErrorType &errorType) {
    int i = 0, tmp;
    while (text[i] != '\0'){
        if ((tmp = (int)ReadWhitespace(text + i)) > 0)
            i += tmp;
        else if ((tmp = ReadInstruction(text + i, instrl, errorType)) > 0)
            i += tmp;
        else {
            if (tmp != 0)
                return tmp - i;
            else {
                errorType = Script::ErrorType::SCRPT_ERROR_UNKNOW;
                return -i;
            }
        }
    }
    return i;
}